

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.h
# Opt level: O2

void __thiscall cmFindCommon::PathGroup::PathGroup(PathGroup *this,string *label)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)label);
  cmPathLabel::cmPathLabel(&this->super_cmPathLabel,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

PathGroup(const std::string& label)
      : cmPathLabel(label)
    {
    }